

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O3

int covered(double *child_cub,double *points_x,double *points_y,double *points_z,double disk_raduis,
           int hit)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  
  if (hit < 0) {
    return 0;
  }
  bVar1 = true;
  uVar2 = 0;
  do {
    uVar3 = 0xfffffffffffffffd;
    dVar4 = 0.0;
    do {
      dVar5 = SQRT((child_cub[uVar3 + 5] - points_z[uVar2]) *
                   (child_cub[uVar3 + 5] - points_z[uVar2]) +
                   (child_cub[uVar3 + 3] - points_x[uVar2]) *
                   (child_cub[uVar3 + 3] - points_x[uVar2]) +
                   (child_cub[uVar3 + 4] - points_y[uVar2]) *
                   (child_cub[uVar3 + 4] - points_y[uVar2]));
      if (dVar5 <= dVar4) {
        dVar5 = dVar4;
      }
      uVar3 = uVar3 + 3;
      dVar4 = dVar5;
    } while (uVar3 < 0x15);
    if (dVar5 < disk_raduis) break;
    bVar1 = uVar2 < (uint)hit;
    uVar2 = uVar2 + 1;
  } while (uVar2 != hit + 1);
  return (uint)bVar1;
}

Assistant:

int covered(double *child_cub,double *points_x,double *points_y,double *points_z, double disk_raduis,int hit)
{
	double distance;
	double max_distance;
	for (int m = 0; m <= hit; m++)
	{
		max_distance=0.0;
		for (int i = 0; i < 24; i=i+3)
		{
			distance=dist_two_points_3d(points_x[m],points_y[m],points_z[m],child_cub[i],child_cub[i+1],child_cub[i+2]);
			if (distance>max_distance) max_distance=distance;
		}
		if (max_distance < disk_raduis) return(1);
	}
	return(0);
}